

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raymath.h
# Opt level: O1

Vector3 Vector3ClampValue(Vector3 v,float min,float max)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  Vector3 VVar5;
  
  fVar2 = v.z;
  fVar4 = v.x;
  fVar3 = v.y;
  fVar1 = fVar2 * fVar2 + fVar4 * fVar4 + fVar3 * fVar3;
  if (0.0 < fVar1) {
    if (fVar1 < 0.0) {
      fVar1 = sqrtf(fVar1);
    }
    else {
      fVar1 = SQRT(fVar1);
    }
    if (min <= fVar1) {
      if (fVar1 <= max) {
        fVar1 = 1.0;
      }
      else {
        fVar1 = max / fVar1;
      }
    }
    else {
      fVar1 = min / fVar1;
    }
    fVar4 = fVar4 * fVar1;
    fVar3 = fVar3 * fVar1;
    fVar2 = fVar2 * fVar1;
  }
  VVar5.y = fVar3;
  VVar5.x = fVar4;
  VVar5.z = fVar2;
  return VVar5;
}

Assistant:

RMAPI Vector3 Vector3ClampValue(Vector3 v, float min, float max)
{
    Vector3 result = v;

    float length = (v.x*v.x) + (v.y*v.y) + (v.z*v.z);
    if (length > 0.0f)
    {
        length = sqrtf(length);

        float scale = 1;    // By default, 1 as the neutral element.
        if (length < min)
        {
            scale = min/length;
        }
        else if (length > max)
        {
            scale = max/length;
        }

        result.x = v.x*scale;
        result.y = v.y*scale;
        result.z = v.z*scale;
    }

    return result;
}